

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

span<const_slang::ast::Expression_*const,_18446744073709551615UL> __thiscall
slang::ast::NetAliasSymbol::getNetReferences(NetAliasSymbol *this)

{
  ParentList *pPVar1;
  Compilation *pCVar2;
  Scope *scope;
  SyntaxNode *pSVar3;
  Type *this_00;
  Compilation *this_01;
  pointer pNVar4;
  size_type sVar5;
  pointer pNVar6;
  size_type sVar7;
  DriverBitRange secondRange;
  size_type sVar8;
  bool bVar9;
  int iVar10;
  bitwidth_t bVar11;
  bitwidth_t arg;
  ExpressionSyntax *pEVar12;
  undefined4 extraout_var;
  Diagnostic *this_03;
  Diagnostic *this_04;
  pointer ppEVar13;
  pointer pNVar14;
  Compilation *pCVar15;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_02;
  Compilation *pCVar16;
  Compilation *pCVar17;
  Compilation *pCVar18;
  ulong uVar19;
  Compilation *dst;
  pointer pNVar20;
  unsigned_long uVar21;
  long lVar22;
  long lVar23;
  Compilation *pCVar24;
  pointer pNVar25;
  pointer pNVar26;
  __extent_storage<18446744073709551615UL> _Var27;
  LookupLocation LVar28;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar29;
  DriverBitRange firstRange;
  uint local_5b4;
  const_iterator __begin2;
  Expression *local_558;
  unsigned_long local_550;
  unsigned_long uStack_548;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  NetAliasVisitor visitor;
  SmallVector<slang::SmallVector<slang::ast::NetAlias,_2UL>,_2UL> netAliases;
  ASTContext context;
  EvalContext evalCtx;
  Expression *this_02;
  undefined4 extraout_var_00;
  
  if ((this->netRefs).
      super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ._M_engaged == true) {
    ppEVar13 = (this->netRefs).
               super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
               ._M_payload._M_value._M_ptr;
    _Var27._M_extent_value =
         (this->netRefs).
         super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
         ._M_payload._M_value._M_extent._M_extent_value;
  }
  else {
    scope = (this->super_Symbol).parentScope;
    pSVar3 = (this->super_Symbol).originatingSyntax;
    buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
         (pointer)buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
    buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
    buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
    LVar28 = LookupLocation::after(&this->super_Symbol);
    context.lookupIndex = LVar28.index;
    context.flags.m_bits = 0x100000020;
    context.randomizeDetails = (RandomizeDetails *)0x0;
    context.assertionInstance = (AssertionInstanceDetails *)0x0;
    context.instanceOrProc = (Symbol *)0x0;
    context.firstTempVar = (TempVarSymbol *)0x0;
    evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
         (pointer)evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement;
    evalCtx.astCtx.assertionInstance = (AssertionInstanceDetails *)0x0;
    evalCtx.astCtx.firstTempVar = (TempVarSymbol *)0x0;
    evalCtx.astCtx.randomizeDetails = (RandomizeDetails *)0x0;
    evalCtx.astCtx.flags.m_bits = 0x100000020;
    evalCtx.astCtx.instanceOrProc = (Symbol *)0x0;
    evalCtx.astCtx._12_4_ = context._12_4_;
    evalCtx.flags.m_bits = '\0';
    evalCtx._60_8_ = 0;
    evalCtx._68_8_ = 0;
    evalCtx.queueTarget._4_4_ = 0;
    evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
    evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
    evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
         (pointer)evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
    evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
    evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
    evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
    .data_ = (pointer)evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                      super_SmallVectorBase<slang::Diagnostic>.firstElement;
    evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
    .len = 0;
    evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
    .cap = 2;
    evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.data_ =
         (pointer)evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
    evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.len = 0;
    evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.cap = 2;
    visitor.commonNetType = (NetType *)0x0;
    visitor.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.data_ =
         (pointer)visitor.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.firstElement;
    visitor.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.len = 0;
    evalCtx.backtraceReported = false;
    evalCtx.disableRange.startLoc = (SourceLocation)0x0;
    evalCtx.disableRange.endLoc = (SourceLocation)0x0;
    visitor.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.cap = 2;
    src = (EVP_PKEY_CTX *)
          netAliases.super_SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>.
          firstElement;
    netAliases.super_SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>.len = 0;
    visitor.evalCtx = &evalCtx;
    pPVar1 = (ParentList *)(pSVar3 + 4);
    __begin2.index = 0;
    visitor.issuedError = false;
    netAliases.super_SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>.cap = 2;
    lVar23 = *(long *)(pSVar3 + 6);
    uVar19 = 0;
    arg = 0;
    __begin2.list = pPVar1;
    visitor.context = &context;
    netAliases.super_SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>.data_ =
         (pointer)src;
    context.scope.ptr = scope;
    evalCtx.astCtx.scope.ptr = scope;
    evalCtx.astCtx.lookupIndex = context.lookupIndex;
    for (; (__begin2.list != pPVar1 || (__begin2.index != lVar23 + 1U >> 1));
        __begin2.index = __begin2.index + 1) {
      pEVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                iterator_base<const_slang::syntax::ExpressionSyntax_*>::dereference(&__begin2);
      iVar10 = Expression::bind((int)pEVar12,(sockaddr *)&context,0);
      this_02 = (Expression *)CONCAT44(extraout_var,iVar10);
      bVar9 = Expression::requireLValue
                        (this_02,&context,(SourceLocation)0x0,(bitmask<slang::ast::AssignFlags>)0x0,
                         (Expression *)0x0);
      src = extraout_RDX;
      if (bVar9) {
        this_00 = (this_02->type).ptr;
        if (arg == 0) {
          arg = Type::getBitWidth(this_00);
        }
        else {
          bVar11 = Type::getBitWidth(this_00);
          if ((arg != bVar11) && ((uVar19 & 1) == 0)) {
            this_03 = ASTContext::addDiag(&context,(DiagCode)0x890006,this_02->sourceRange);
            bVar11 = Type::getBitWidth((this_02->type).ptr);
            this_04 = Diagnostic::operator<<<unsigned_int>(this_03,bVar11);
            uVar19 = CONCAT71((int7)((ulong)this_03 >> 8),1);
            Diagnostic::operator<<<unsigned_int>(this_04,arg);
          }
        }
        Expression::visit<slang::ast::NetAliasVisitor&>(this_02,&visitor);
        local_558 = this_02;
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)&buffer,&local_558);
        src = extraout_RDX_00;
        if (visitor.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.len != 0) {
          SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>>::
          emplace_back<slang::SmallVector<slang::ast::NetAlias,2ul>>
                    ((SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,2ul>> *)&netAliases,
                     &visitor.netAliases);
          visitor.netAliases.super_SmallVectorBase<slang::ast::NetAlias>.len = 0;
          src = extraout_RDX_01;
        }
      }
    }
    dst = scope->compilation;
    iVar10 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                       (&buffer.super_SmallVectorBase<const_slang::ast::Expression_*>,
                        (EVP_PKEY_CTX *)dst,src);
    sVar8 = netAliases.super_SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>.len;
    ppEVar13 = (pointer)CONCAT44(extraout_var_00,iVar10);
    if ((this->netRefs).
        super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
        ._M_engaged == false) {
      (this->netRefs).
      super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ._M_engaged = true;
    }
    (this->netRefs).
    super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ._M_payload._M_value._M_ptr = ppEVar13;
    (this->netRefs).
    super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ._M_payload._M_value._M_extent._M_extent_value = extraout_RDX_02;
    _Var27._M_extent_value = extraout_RDX_02;
    if (((uVar19 & 1) == 0) &&
       (netAliases.super_SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>.len != 0))
    {
      this_01 = scope->compilation;
      pCVar2 = (Compilation *)
               (netAliases.super_SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>.len
               - 1);
      local_5b4 = (uint)dst;
      pCVar15 = pCVar2;
      pCVar17 = (Compilation *)0x0;
      while (pCVar16 = pCVar17, pCVar16 != pCVar2) {
        pCVar17 = (Compilation *)((long)&(pCVar16->super_BumpAllocator).head + 1);
        for (dst = pCVar17; dst < sVar8;
            dst = (Compilation *)((long)&(dst->super_BumpAllocator).head + 1)) {
          pNVar4 = netAliases.super_SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>.
                   data_[(long)pCVar16].super_SmallVectorBase<slang::ast::NetAlias>.data_;
          sVar5 = netAliases.super_SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>.
                  data_[(long)pCVar16].super_SmallVectorBase<slang::ast::NetAlias>.len;
          pNVar6 = netAliases.super_SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>.
                   data_[(long)dst].super_SmallVectorBase<slang::ast::NetAlias>.data_;
          sVar7 = netAliases.super_SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>.
                  data_[(long)dst].super_SmallVectorBase<slang::ast::NetAlias>.len;
          bVar9 = false;
          pNVar14 = pNVar4;
          pNVar20 = pNVar6;
          while ((pNVar14 != pNVar4 + sVar5 && (pNVar20 != pNVar6 + sVar7))) {
            pCVar18 = (Compilation *)(pNVar14->bounds).first;
            uVar21 = (pNVar14->bounds).second;
            pCVar24 = (Compilation *)(pNVar20->bounds).first;
            uStack_548 = (pNVar20->bounds).second;
            if (bVar9) {
              if ((local_5b4 & 1) == 0) {
                bVar9 = false;
                uStack_548 = uVar19;
                pCVar24 = pCVar15;
              }
              else {
                bVar9 = false;
                pCVar18 = pCVar15;
                uVar21 = uVar19;
              }
            }
            lVar22 = uVar21 - (long)pCVar18;
            lVar23 = uStack_548 - (long)pCVar24;
            if (lVar22 + 1U < lVar23 + 1U) {
              uVar19 = uStack_548 - (lVar22 + 1U);
              if (!bVar9) {
                bVar9 = true;
              }
              local_5b4 = 0;
              lVar23 = lVar22;
              pCVar15 = pCVar24;
              pNVar25 = pNVar20;
              pNVar26 = pNVar14 + 1;
            }
            else {
              pNVar25 = pNVar20 + 1;
              if (lVar22 == lVar23) {
                lVar23 = lVar22;
                pNVar26 = pNVar14 + 1;
              }
              else {
                uVar19 = uVar21 - (lVar23 + 1U);
                if (!bVar9) {
                  bVar9 = true;
                }
                local_5b4 = 1;
                pCVar15 = pCVar18;
                pNVar26 = pNVar14;
              }
            }
            firstRange.first = uVar21 - lVar23;
            local_550 = uStack_548 - lVar23;
            secondRange.second = uStack_548;
            secondRange.first = local_550;
            firstRange.second = uVar21;
            Compilation::noteNetAlias
                      (this_01,scope,&((pNVar14->sym).ptr)->super_Symbol,firstRange,
                       (pNVar14->expr).ptr,&((pNVar20->sym).ptr)->super_Symbol,secondRange,
                       (pNVar20->expr).ptr);
            pNVar14 = pNVar26;
            pNVar20 = pNVar25;
          }
        }
      }
      ppEVar13 = (this->netRefs).
                 super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                 ._M_payload._M_value._M_ptr;
      _Var27._M_extent_value =
           (this->netRefs).
           super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
           ._M_payload._M_value._M_extent._M_extent_value;
    }
    SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>::cleanup
              (&netAliases.super_SmallVectorBase<slang::SmallVector<slang::ast::NetAlias,_2UL>_>,
               (EVP_PKEY_CTX *)dst);
    SmallVectorBase<slang::ast::NetAlias>::cleanup
              (&visitor.netAliases.super_SmallVectorBase<slang::ast::NetAlias>,(EVP_PKEY_CTX *)dst);
    EvalContext::~EvalContext(&evalCtx);
    SmallVectorBase<const_slang::ast::Expression_*>::cleanup
              (&buffer.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)dst);
  }
  sVar29._M_extent._M_extent_value = _Var27._M_extent_value;
  sVar29._M_ptr = ppEVar13;
  return sVar29;
}

Assistant:

std::span<const Expression* const> NetAliasSymbol::getNetReferences() const {
    if (netRefs)
        return *netRefs;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    SmallVector<const Expression*> buffer;
    ASTContext context(*scope, LookupLocation::after(*this),
                       ASTFlags::NonProcedural | ASTFlags::NotADriver);
    EvalContext evalCtx(context);
    NetAliasVisitor visitor(context, evalCtx);
    SmallVector<SmallVector<NetAlias>> netAliases;
    bitwidth_t bitWidth = 0;
    bool issuedError = false;

    for (auto exprSyntax : syntax->as<NetAliasSyntax>().nets) {
        auto& netRef = Expression::bind(*exprSyntax, context);
        if (!netRef.requireLValue(context))
            continue;

        if (!bitWidth) {
            bitWidth = netRef.type->getBitWidth();
        }
        else if (bitWidth != netRef.type->getBitWidth() && !issuedError) {
            auto& diag = context.addDiag(diag::NetAliasWidthMismatch, netRef.sourceRange);
            diag << netRef.type->getBitWidth() << bitWidth;
            issuedError = true;
        }

        netRef.visit(visitor);
        buffer.push_back(&netRef);
        if (!visitor.netAliases.empty()) {
            netAliases.emplace_back(std::move(visitor.netAliases));
            visitor.netAliases.clear();
        }
    }

    netRefs = buffer.copy(scope->getCompilation());
    if (issuedError || netAliases.empty())
        return *netRefs;

    // Compare every net alias expression to every other, finding the set of
    // bits that overlap and adding drivers for them so that we can catch
    // and report on duplicate and/or self aliases.
    auto& comp = scope->getCompilation();
    const size_t numAliases = netAliases.size();
    for (size_t i = 0; i < numAliases - 1; i++) {
        for (size_t j = i + 1; j < numAliases; j++) {
            auto& first = netAliases[i];
            auto& second = netAliases[j];
            auto firstIt = first.begin();
            auto firstEnd = first.end();
            auto secondIt = second.begin();
            auto secondEnd = second.end();

            // Compare each net reference or selection from the left hand side
            // to the corresponding elements on the right hand side. The individual
            // elements can differ in width, so consume bits from the larger side
            // and only advance when a side has been consumed.
            std::optional<std::pair<DriverBitRange, bool>> remainder;
            while (firstIt != firstEnd && secondIt != secondEnd) {
                auto& firstAlias = *firstIt;
                auto& secondAlias = *secondIt;
                auto firstRange = firstAlias.bounds;
                auto secondRange = secondAlias.bounds;

                if (remainder) {
                    if (remainder->second)
                        firstRange = remainder->first;
                    else
                        secondRange = remainder->first;
                    remainder.reset();
                }

                auto firstWidth = firstRange.second - firstRange.first + 1;
                auto secondWidth = secondRange.second - secondRange.first + 1;

                uint64_t width;
                if (firstWidth < secondWidth) {
                    width = firstWidth;
                    remainder = std::pair(
                        DriverBitRange(secondRange.first, secondRange.second - width), false);
                    firstIt++;
                }
                else {
                    width = secondWidth;
                    secondIt++;

                    if (firstWidth == secondWidth)
                        firstIt++;
                    else {
                        remainder = std::pair(
                            DriverBitRange(firstRange.first, firstRange.second - width), true);
                    }
                }

                comp.noteNetAlias(*scope, *firstAlias.sym,
                                  {firstRange.second - width + 1, firstRange.second},
                                  *firstAlias.expr, *secondAlias.sym,
                                  {secondRange.second - width + 1, secondRange.second},
                                  *secondAlias.expr);
            }
        }
    }

    return *netRefs;
}